

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O2

confirm * __thiscall
lest::for_test<lest::confirm>(lest *this,tests *specification,texts *in,confirm *perform,int n)

{
  bool bVar1;
  int iVar2;
  confirm *pcVar3;
  fd_set *__exceptfds;
  int iVar4;
  fd_set *__writefds;
  undefined4 in_register_00000084;
  test *ptVar5;
  string local_78 [32];
  test local_58;
  
  iVar4 = 0;
  pcVar3 = perform;
  do {
    iVar2 = (int)pcVar3;
    __exceptfds = (fd_set *)CONCAT71((int7)((ulong)pcVar3 >> 8),iVar2 <= iVar4);
    if (iVar2 != -1 && iVar2 <= iVar4) {
      return (confirm *)in;
    }
    for (ptVar5 = *(test **)this; ptVar5 != *(test **)(this + 8); ptVar5 = ptVar5 + 1) {
      std::__cxx11::string::string(local_78,(string *)ptVar5);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&stack0xffffffffffffff70,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)specification);
      iVar2 = select((int)local_78,(fd_set *)&stack0xffffffffffffff70,__writefds,__exceptfds,
                     (timeval *)CONCAT44(in_register_00000084,n));
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&stack0xffffffffffffff70);
      std::__cxx11::string::~string(local_78);
      if ((char)iVar2 != '\0') {
        test::test(&local_58,ptVar5);
        pcVar3 = confirm::operator()((confirm *)in,&local_58);
        bVar1 = (pcVar3->output).opt.abort;
        iVar2 = pcVar3->failures;
        std::__cxx11::string::~string((string *)&local_58);
        if ((bVar1 == true) && (0 < iVar2)) {
          return (confirm *)in;
        }
      }
    }
    iVar4 = iVar4 + 1;
    pcVar3 = (confirm *)((ulong)perform & 0xffffffff);
  } while( true );
}

Assistant:

Action & for_test( tests specification, texts in, Action & perform, int n = 1 )
{
    for ( int i = 0; indefinite( n ) || i < n; ++i )
    {
        for ( tests::iterator pos = specification.begin(); pos != specification.end() ; ++pos )
        {
            test & testing = *pos;

            if ( select( testing.name, in ) )
                if ( abort( perform( testing ) ) )
                    return perform;
        }
    }
    return perform;
}